

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::TestBody(Secp256k1_EmptyContextErrorTest_Test *this)

{
  bool bVar1;
  long lVar2;
  initializer_list<cfd::core::ByteData> __l;
  allocator_type local_bb;
  allocator local_ba;
  allocator local_b9;
  AssertHelper local_b8 [4];
  ByteData actual;
  ByteData local_80;
  Secp256k1 secp;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_vector;
  string local_48 [32];
  
  cfd::core::Secp256k1::Secp256k1(&secp,(void *)0x0);
  std::__cxx11::string::string
            ((string *)local_b8,"03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"
             ,&local_b9);
  cfd::core::ByteData::ByteData(&actual,(string *)local_b8);
  std::__cxx11::string::string
            (local_48,"0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe",&local_ba
            );
  cfd::core::ByteData::ByteData(&local_80,local_48);
  __l._M_len = 2;
  __l._M_array = &actual;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&test_vector,__l,&local_bb);
  lVar2 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&actual.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)local_b8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((vector *)&actual);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
  }
  testing::Message::Message((Message *)&actual);
  testing::internal::AssertHelper::AssertHelper
            (local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
             ,0x93,
             "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_b8,(Message *)&actual);
  testing::internal::AssertHelper::~AssertHelper(local_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&actual);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&test_vector);
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}